

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_union_type_vector
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t union_index,
                 flatbuffers_voffset_t id,size_t handle,
                 flatcc_json_parser_integral_symbol_f **type_parsers,
                 flatcc_json_parser_union_f *union_parser,
                 flatcc_json_parser_is_known_type_f *accept_type)

{
  long lVar1;
  __flatcc_json_parser_union_entry_t *p_Var2;
  size_t sVar3;
  int iVar4;
  flatcc_builder_ref_t fVar5;
  void *pvVar6;
  char *pcVar7;
  size_t sVar8;
  size_t handle_00;
  void *__src;
  flatcc_builder_ref_t *pfVar9;
  flatbuffers_uoffset_t count;
  size_t h_types;
  size_t size;
  flatbuffers_utype_t *types;
  flatcc_builder_ref_t *pref;
  flatcc_builder_ref_t ref;
  void *pval;
  flatbuffers_utype_t val;
  undefined8 uStack_68;
  int more;
  char *line_start;
  char *pcStack_58;
  int line;
  char *mark;
  __flatcc_json_parser_union_entry_t *e;
  __flatcc_json_parser_union_frame_t *f;
  size_t handle_local;
  size_t sStack_30;
  flatbuffers_voffset_t id_local;
  size_t union_index_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  f = (__flatcc_json_parser_union_frame_t *)handle;
  handle_local._6_2_ = id;
  sStack_30 = union_index;
  union_index_local = (size_t)end;
  end_local = buf;
  buf_local = (char *)ctx;
  e = (__flatcc_json_parser_union_entry_t *)flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  mark = (char *)&e[sStack_30].line;
  if (*(char *)((long)mark + 0x14) == '\0') {
    *(undefined1 *)((long)mark + 0x14) = 1;
    iVar4 = flatcc_builder_start_vector(*(flatcc_builder_t **)buf_local,1,1,0xffffffff);
    if (iVar4 == 0) {
      end_local = flatcc_json_parser_array_start
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)union_index_local,
                             (int *)((long)&pval + 4));
      while (pval._4_4_ != 0) {
        pvVar6 = flatcc_builder_extend_vector(*(flatcc_builder_t **)buf_local,1);
        if (pvVar6 == (void *)0x0) goto LAB_0010f4d0;
        pcStack_58 = end_local;
        end_local = flatcc_json_parser_uint8
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)union_index_local
                               ,(uint8_t *)((long)&pval + 3));
        if ((pcStack_58 == end_local) &&
           ((pcStack_58 = end_local,
            end_local = flatcc_json_parser_symbolic_uint8
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)union_index_local,type_parsers,
                                   (uint8_t *)((long)&pval + 3)), end_local == pcStack_58 ||
            (end_local == (char *)union_index_local)))) goto LAB_0010f4d0;
        iVar4 = (*accept_type)(pval._3_1_);
        if (iVar4 == 0) {
          if ((*(uint *)(buf_local + 0x10) & 1) == 0) {
            pcVar7 = flatcc_json_parser_set_error
                               ((flatcc_json_parser_t *)buf_local,end_local,
                                (char *)union_index_local,0xf);
            return pcVar7;
          }
          pval._3_1_ = '\0';
        }
        flatbuffers_uint8_write_to_pe(pvVar6,pval._3_1_);
        end_local = flatcc_json_parser_array_end
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)union_index_local
                               ,(int *)((long)&pval + 4));
      }
      sVar8 = flatcc_builder_vector_count(*(flatcc_builder_t **)buf_local);
      *(flatbuffers_uoffset_t *)(mark + 0x18) = (flatbuffers_uoffset_t)sVar8;
      handle_00 = flatcc_builder_enter_user_frame
                            (*(flatcc_builder_t **)buf_local,sVar8 & 0xffffffff);
      pvVar6 = flatcc_builder_get_user_frame_ptr(*(flatcc_builder_t **)buf_local,handle_00);
      __src = flatcc_builder_vector_edit(*(flatcc_builder_t **)buf_local);
      memcpy(pvVar6,__src,sVar8 & 0xffffffff);
      fVar5 = flatcc_builder_end_vector(*(flatcc_builder_t **)buf_local);
      if ((fVar5 != 0) &&
         (pfVar9 = flatcc_builder_table_add_offset
                             (*(flatcc_builder_t **)buf_local,handle_local._6_2_ - 1),
         pfVar9 != (flatcc_builder_ref_t *)0x0)) {
        *pfVar9 = fVar5;
        e = (__flatcc_json_parser_union_entry_t *)
            flatcc_builder_get_user_frame_ptr(*(flatcc_builder_t **)buf_local,(size_t)f);
        sVar3 = union_index_local;
        p_Var2 = e + sStack_30;
        mark = (char *)&p_Var2->line;
        *(size_t *)((long)mark + 0x20) = handle_00;
        lVar1._0_4_ = p_Var2->line;
        lVar1._4_1_ = p_Var2->type_present;
        lVar1._5_1_ = p_Var2->type;
        lVar1._6_2_ = *(undefined2 *)&p_Var2->field_0x16;
        if (lVar1 == 0) {
          e->line_start = e->line_start + 1;
          return end_local;
        }
        if (e->line_start != (char *)0x0) {
          e->line_start = e->line_start + -1;
          line_start._4_4_ = *(undefined4 *)(buf_local + 0x18);
          uStack_68 = *(undefined8 *)(buf_local + 8);
          *(int *)(buf_local + 0x18) = (int)*(size_t *)((long)mark + 0x10);
          *(undefined8 *)(buf_local + 8) = *(undefined8 *)((long)mark + 8);
          pcVar7 = _parse_union_vector((flatcc_json_parser_t *)buf_local,*(char **)mark,
                                       (char *)union_index_local,handle_00,
                                       (flatbuffers_uoffset_t)sVar8,handle_local._6_2_,union_parser)
          ;
          if ((char *)sVar3 == pcVar7) {
            return (char *)union_index_local;
          }
          *(undefined4 *)(buf_local + 0x18) = line_start._4_4_;
          *(undefined8 *)(buf_local + 8) = uStack_68;
          return end_local;
        }
        __assert_fail("f->union_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_parser.c"
                      ,0x4d8,
                      "const char *flatcc_json_parser_union_type_vector(flatcc_json_parser_t *, const char *, const char *, size_t, flatbuffers_voffset_t, size_t, flatcc_json_parser_integral_symbol_f **, flatcc_json_parser_union_f *, flatcc_json_parser_is_known_type_f *)"
                     );
      }
    }
LAB_0010f4d0:
    ctx_local = (flatcc_json_parser_t *)
                flatcc_json_parser_set_error
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)union_index_local,
                           0x23);
  }
  else {
    ctx_local = (flatcc_json_parser_t *)
                flatcc_json_parser_set_error
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)union_index_local,
                           0x1c);
  }
  return (char *)ctx_local;
}

Assistant:

const char *flatcc_json_parser_union_type_vector(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t union_index, flatbuffers_voffset_t id,
        size_t handle,
        flatcc_json_parser_integral_symbol_f *type_parsers[],
        flatcc_json_parser_union_f *union_parser,
        flatcc_json_parser_is_known_type_f accept_type)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    __flatcc_json_parser_union_entry_t *e = f->unions + union_index;

    const char *mark;
    int line;
    const char *line_start;
    int more;
    utype_t val;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    utype_t *types;
    size_t size;
    size_t h_types;
    uoffset_t count;

#if FLATBUFFERS_UTYPE_MAX != UINT8_MAX
#error "Update union vector parser to support current union type definition."
#endif

    if (e->type_present) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    e->type_present = 1;
    if (flatcc_builder_start_vector(ctx->ctx, 1, 1, FLATBUFFERS_COUNT_MAX((utype_size)))) goto failed;
    buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
    while (more) {
        if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
        buf = flatcc_json_parser_uint8(ctx, (mark = buf), end, &val);
        if (mark == buf) {
            buf = flatcc_json_parser_symbolic_uint8(ctx, (mark = buf), end, type_parsers, &val);
            if (buf == mark || buf == end) goto failed;
        }
        /* Parse unknown types as NONE */
        if (!accept_type(val)) {
            if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
            }
            val = 0;
        }
        flatbuffers_uint8_write_to_pe(pval, val);
        buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
    }
    count = (uoffset_t)flatcc_builder_vector_count(ctx->ctx);
    e->count = count;
    size = count * utype_size;
    /* Store type vector so it is accessible to the table vector parser.  */
    h_types = flatcc_builder_enter_user_frame(ctx->ctx, size);
    types = flatcc_builder_get_user_frame_ptr(ctx->ctx, h_types);
    memcpy(types, flatcc_builder_vector_edit(ctx->ctx), size);
    if (!((ref = flatcc_builder_end_vector(ctx->ctx)))) goto failed;
    if (!(pref = flatcc_builder_table_add_offset(ctx->ctx, id - 1))) goto failed;
    *pref = ref;

    /* Restore union frame after possible invalidation due to types frame allocation. */
    f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    e = f->unions + union_index;

    e->h_types = h_types;
    if (e->backtrace == 0) {
        ++f->union_count;
        return buf;
    }
    FLATCC_ASSERT(f->union_count);
    --f->union_count;
    line = ctx->line;
    line_start = ctx->line_start;
    ctx->line = e->line;
    ctx->line_start = e->line_start;
    /* We must not assign buf here because we are backtracking. */
    if (end == _parse_union_vector(ctx, e->backtrace, end, h_types, count, id, union_parser)) return end;
    /*
     * NOTE: We do not need the user frame anymore, but if we did, it
     * would have to be restored from its handle due to the above parse.
     */
    ctx->line = line;
    ctx->line_start = line_start;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}